

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_17c240::ExprComparator::VisitCall(ExprComparator *this,CallExpr e)

{
  Kind KVar1;
  bool bVar2;
  int kind_2;
  Kind KVar3;
  int iVar4;
  int kind;
  Kind KVar5;
  Impl *pIVar6;
  ulong uVar7;
  ExprBase e2;
  ExprBase e1;
  Impl *pIVar8;
  
  pIVar8 = (this->expr_).super_ExprBase.impl_;
  pIVar6 = (Impl *)0x0;
  if (pIVar8->kind_ != CALL) {
    pIVar8 = pIVar6;
  }
  if (*(long *)(pIVar8 + 2) ==
      *(long *)((long)e.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.impl_
               + 8)) {
    KVar1 = pIVar8[4].kind_;
    if (KVar1 == *(Kind *)((long)e.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                 super_ExprBase.impl_ + 0x10)) {
      pIVar6 = (Impl *)(ulong)((int)KVar1 < 1);
      if (0 < (int)KVar1) {
        e1.impl_ = *(Impl **)(pIVar8 + 6);
        e2.impl_ = *(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                    super_ExprBase.impl_ + 0x18);
        KVar5 = (e1.impl_)->kind_;
        KVar3 = (e2.impl_)->kind_;
        if (KVar5 == KVar3) {
          uVar7 = 0;
          do {
            if (KVar5 - BOOL < 0xffffffd1) {
              if (KVar5 != STRING) {
                e1.impl_ = (Impl *)0x0;
              }
              if (KVar3 != STRING) {
                e2.impl_ = (Impl *)0x0;
              }
              iVar4 = strcmp((char *)(e1.impl_ + 1),(char *)(e2.impl_ + 1));
              if (iVar4 != 0) break;
            }
            else {
              if (0x2e < KVar3 - FIRST_EXPR) {
                e2.impl_ = (Impl *)0x0;
              }
              bVar2 = mp::Equal((Expr)e1.impl_,(Expr)e2.impl_);
              if (!bVar2) break;
            }
            pIVar6 = (Impl *)(ulong)((ulong)KVar1 <= uVar7 + 1);
            if ((ulong)KVar1 - 1 == uVar7) break;
            e1.impl_ = *(Impl **)(pIVar8 + uVar7 * 2 + 8);
            e2.impl_ = *(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                        super_ExprBase.impl_ + 0x20 + uVar7 * 8);
            KVar5 = (e1.impl_)->kind_;
            KVar3 = (e2.impl_)->kind_;
            uVar7 = uVar7 + 1;
          } while (KVar5 == KVar3);
        }
      }
    }
    else {
      pIVar6 = (Impl *)0x0;
    }
  }
  return SUB81(pIVar6,0);
}

Assistant:

bool ExprComparator::VisitCall(CallExpr e) {
  CallExpr call = Cast<CallExpr>(expr_);
  int num_args = call.num_args();
  if (call.function() != e.function() || num_args != e.num_args())
    return false;
  for (int i = 0; i < num_args; ++i) {
    Expr arg = call.arg(i), other_arg = e.arg(i);
    if (arg.kind() != other_arg.kind())
      return false;
    if (NumericExpr num_arg = Cast<NumericExpr>(arg)) {
      if (!Equal(num_arg, Cast<NumericExpr>(other_arg)))
        return false;
    } else if (std::strcmp(
            Cast<StringLiteral>(arg).value(),
            Cast<StringLiteral>(other_arg).value()) != 0)
      return false;
  }
  return true;
}